

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irExpression *
build_ir_compare(Context_conflict *ctx,MOJOSHADER_irConditionType operation,
                MOJOSHADER_irExpression *left,MOJOSHADER_irExpression *right,
                MOJOSHADER_irExpression *tval,MOJOSHADER_irExpression *fval)

{
  MOJOSHADER_astDataTypeType type;
  int elements_00;
  int iftrue;
  int iffalse;
  int label;
  int index;
  MOJOSHADER_irStatement *pMVar1;
  MOJOSHADER_irStatement *pMVar2;
  MOJOSHADER_irExpression *pMVar3;
  MOJOSHADER_irStatement *pMVar4;
  MOJOSHADER_irStatement *pMVar5;
  MOJOSHADER_irStatement *pMVar6;
  MOJOSHADER_irStatement *pMVar7;
  MOJOSHADER_irStatement *next;
  int elements;
  MOJOSHADER_astDataTypeType dt;
  int tmp;
  int join;
  int f;
  int t;
  MOJOSHADER_irExpression *fval_local;
  MOJOSHADER_irExpression *tval_local;
  MOJOSHADER_irExpression *right_local;
  MOJOSHADER_irExpression *left_local;
  MOJOSHADER_irConditionType operation_local;
  Context_conflict *ctx_local;
  
  iftrue = generate_ir_label(ctx);
  iffalse = generate_ir_label(ctx);
  label = generate_ir_label(ctx);
  index = generate_ir_temp(ctx);
  if (((tval == (MOJOSHADER_irExpression *)0x0) || (fval == (MOJOSHADER_irExpression *)0x0)) ||
     ((tval->info).type != (fval->info).type)) {
    __assert_fail("tval && fval && (tval->info.type == fval->info.type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x12e9,
                  "MOJOSHADER_irExpression *build_ir_compare(Context *, const MOJOSHADER_irConditionType, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *)"
                 );
  }
  if (((tval != (MOJOSHADER_irExpression *)0x0) && (fval != (MOJOSHADER_irExpression *)0x0)) &&
     ((tval->info).elements == (fval->info).elements)) {
    type = (tval->info).type;
    elements_00 = (tval->info).elements;
    pMVar1 = new_ir_cjump(ctx,operation,left,right,iftrue,iffalse);
    pMVar2 = new_ir_label(ctx,iftrue);
    pMVar3 = new_ir_temp(ctx,index,type,elements_00);
    pMVar4 = new_ir_move(ctx,pMVar3,tval,-1);
    pMVar5 = new_ir_jump(ctx,label);
    pMVar6 = new_ir_label(ctx,iffalse);
    pMVar3 = new_ir_temp(ctx,index,type,elements_00);
    pMVar7 = new_ir_move(ctx,pMVar3,fval,-1);
    next = new_ir_label(ctx,label);
    pMVar7 = new_ir_seq(ctx,pMVar7,next);
    pMVar6 = new_ir_seq(ctx,pMVar6,pMVar7);
    pMVar5 = new_ir_seq(ctx,pMVar5,pMVar6);
    pMVar4 = new_ir_seq(ctx,pMVar4,pMVar5);
    pMVar2 = new_ir_seq(ctx,pMVar2,pMVar4);
    pMVar1 = new_ir_seq(ctx,pMVar1,pMVar2);
    pMVar3 = new_ir_temp(ctx,index,type,elements_00);
    pMVar3 = new_ir_eseq(ctx,pMVar1,pMVar3);
    return pMVar3;
  }
  __assert_fail("tval && fval && (tval->info.elements == fval->info.elements)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x12ea,
                "MOJOSHADER_irExpression *build_ir_compare(Context *, const MOJOSHADER_irConditionType, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *)"
               );
}

Assistant:

static MOJOSHADER_irExpression *build_ir_compare(Context *ctx,
                                    const MOJOSHADER_irConditionType operation,
                                    MOJOSHADER_irExpression *left,
                                    MOJOSHADER_irExpression *right,
                                    MOJOSHADER_irExpression *tval,
                                    MOJOSHADER_irExpression *fval)
{
    /* The gist...
            cjump x < y, t, f  // '<' is whatever operation
        t:
            move tmp, tval
            jump join
        f:
            move tmp, fval
        join:
    */

    const int t = generate_ir_label(ctx);
    const int f = generate_ir_label(ctx);
    const int join = generate_ir_label(ctx);
    const int tmp = generate_ir_temp(ctx);

    assert(tval && fval && (tval->info.type == fval->info.type));
    assert(tval && fval && (tval->info.elements == fval->info.elements));

    const MOJOSHADER_astDataTypeType dt = tval->info.type;
    const int elements = tval->info.elements;

    return new_ir_eseq(ctx,
                new_ir_seq(ctx, new_ir_cjump(ctx, operation, left, right, t, f),
                new_ir_seq(ctx, new_ir_label(ctx, t),
                new_ir_seq(ctx, new_ir_move(ctx, new_ir_temp(ctx, tmp, dt, elements), tval, -1),
                new_ir_seq(ctx, new_ir_jump(ctx, join),
                new_ir_seq(ctx, new_ir_label(ctx, f),
                new_ir_seq(ctx, new_ir_move(ctx, new_ir_temp(ctx, tmp, dt, elements), fval, -1),
                                new_ir_label(ctx, join))))))),
                    new_ir_temp(ctx, tmp, dt, elements));
}